

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  int iVar1;
  SimpleString *pSVar2;
  SimpleString *pSVar3;
  size_t n;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *in_RDX;
  char *in_RSI;
  SimpleString *in_RDI;
  size_t j;
  size_t i;
  char *newbuf;
  size_t newsize;
  size_t withlen;
  size_t tolen;
  size_t len;
  size_t c;
  SimpleString *in_stack_ffffffffffffff90;
  SimpleString *this_00;
  char *buffer;
  SimpleString *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  
  SimpleString(in_stack_ffffffffffffff90,(char *)in_RDI);
  pSVar2 = (SimpleString *)count(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ~SimpleString((SimpleString *)0x111618);
  if (pSVar2 != (SimpleString *)0x0) {
    this_00 = pSVar2;
    pSVar3 = (SimpleString *)size((SimpleString *)0x111638);
    n = StrLen(in_RSI);
    sVar4 = StrLen(in_RDX);
    uVar5 = (long)pSVar3 + (sVar4 * (long)pSVar2 - n * (long)pSVar2) + 1;
    if (uVar5 < 2) {
      setInternalBufferAsEmptyString(this_00);
    }
    else {
      pcVar6 = allocStringBuffer((size_t)this_00,(char *)in_RDI,0x1116a7);
      pSVar2 = (SimpleString *)0x0;
      buffer = (char *)0x0;
      while (pSVar2 < pSVar3) {
        pcVar7 = getBuffer(in_RDI);
        iVar1 = StrNCmp(pcVar7 + (long)pSVar2,in_RSI,n);
        if (iVar1 == 0) {
          StrNCpy(pcVar6 + (long)buffer,in_RDX,sVar4 + 1);
          buffer = buffer + sVar4;
          pSVar2 = (SimpleString *)((long)&pSVar2->buffer_ + n);
        }
        else {
          pcVar7 = getBuffer(in_RDI);
          pcVar6[(long)buffer] = pcVar7[(long)pSVar2];
          buffer = buffer + 1;
          pSVar2 = (SimpleString *)((long)&pSVar2->buffer_ + 1);
        }
      }
      pcVar6[uVar5 - 1] = '\0';
      setInternalBufferTo(pSVar2,buffer,(size_t)this_00);
    }
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    if (c == 0) {
        return;
    }
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&getBuffer()[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = getBuffer()[i];
                j++;
                i++;
            }
        }
        newbuf[newsize - 1] = '\0';
        setInternalBufferTo(newbuf, newsize);
    }
    else
        setInternalBufferAsEmptyString();
}